

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_bin.cc
# Opt level: O1

void GetFileNameParts(string *filename,string *dir,string *file,string *ext)

{
  long lVar1;
  string nodir;
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)filename,0x12905c,0xffffffffffffffff);
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  if (lVar1 == -1) {
    std::__cxx11::string::_M_replace((ulong)dir,0,(char *)dir->_M_string_length,0x1290f9);
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  else {
    std::__cxx11::string::substr((ulong)local_70,(ulong)filename);
    std::__cxx11::string::operator=((string *)dir,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_70,(ulong)filename);
    std::__cxx11::string::operator=((string *)&local_50,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  lVar1 = std::__cxx11::string::rfind((char)&local_50,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)file);
    std::__cxx11::string::_M_replace((ulong)ext,0,(char *)ext->_M_string_length,0x1290f9);
  }
  else {
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_50);
    std::__cxx11::string::operator=((string *)file,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_50);
    std::__cxx11::string::operator=((string *)ext,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void GetFileNameParts(const std::string& filename,
    std::string* dir, std::string* file, std::string* ext) {
  size_t npos = (size_t)(-1);
  size_t slashpos = filename.find_last_of("/\\");
  std::string nodir;
  if (slashpos == npos) {
    *dir = "";
    nodir = filename;
  } else {
    *dir = filename.substr(0, slashpos + 1);
    nodir = filename.substr(slashpos + 1);
  }
  size_t dotpos = nodir.find_last_of('.');
  if (dotpos == (size_t)(-1)) {
    *file = nodir;
    *ext = "";
  } else {
    *file = nodir.substr(0, dotpos);
    *ext = nodir.substr(dotpos);
  }
}